

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

QTextStream * operator<<(QTextStream *out,Rule *r)

{
  _List_node_base *p_Var1;
  QTextStream *pQVar2;
  
  pQVar2 = (QTextStream *)QTextStream::operator<<(out,(QString *)((r->lhs)._M_node + 1));
  QTextStream::operator<<(pQVar2," ::=");
  for (p_Var1 = (r->rhs).
                super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)&r->rhs
      ; p_Var1 = p_Var1->_M_next) {
    pQVar2 = (QTextStream *)QTextStream::operator<<(out," ");
    QTextStream::operator<<(pQVar2,(QString *)(p_Var1[1]._M_next + 1));
  }
  return out;
}

Assistant:

QTextStream &operator << (QTextStream &out, const Rule &r)
{
  out << *r.lhs << " ::=";

  for (NameList::const_iterator name = r.rhs.begin (); name != r.rhs.end (); ++name)
    out << " " << **name;

  return out;
}